

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ApplicativeHelper.cpp
# Opt level: O3

void ApplicativeHelper::getHeadAndArgs(Term *term,TermList *head,Deque<Kernel::TermList> *args)

{
  uint64_t uVar1;
  bool bVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  
  if (*(long *)(args + 0x10) != *(long *)(args + 0x18)) {
    *(undefined8 *)(args + 0x10) = *(undefined8 *)(args + 8);
    *(undefined8 *)(args + 0x18) = *(undefined8 *)(args + 8);
  }
  bVar2 = Kernel::Term::isApplication(term);
  if (bVar2) {
    do {
      uVar1 = term->_args[(ulong)(*(uint *)&term->field_0xc & 0xfffffff) - 3]._content;
      lVar3 = *(long *)(args + 0x10);
      if (*(long *)(args + 0x18) == lVar3 + -8) {
LAB_005160c5:
        Lib::Deque<Kernel::TermList>::expand(args);
        lVar5 = *(long *)(args + 8);
        lVar3 = *(long *)(args + 0x10);
        lVar4 = *(long *)(args + 0x20);
      }
      else {
        lVar5 = *(long *)(args + 8);
        lVar4 = *(long *)(args + 0x20);
        if (*(long *)(args + 0x18) == lVar4 + -8 && lVar3 == lVar5) goto LAB_005160c5;
      }
      if (lVar3 != lVar5) {
        lVar4 = lVar3;
      }
      *(long *)(args + 0x10) = lVar4 + -8;
      *(uint64_t *)(lVar4 + -8) = uVar1;
      term = (Term *)term->_args[(ulong)(*(uint *)&term->field_0xc & 0xfffffff) - 2]._content;
      head->_content = (uint64_t)term;
    } while ((((ulong)term & 3) == 0) && (bVar2 = Kernel::Term::isApplication(term), bVar2));
  }
  return;
}

Assistant:

void ApplicativeHelper::getHeadAndArgs(const Term* term, TermList& head, Deque<TermList>& args)
{
  ASS(term->isApplication());

  if(!args.isEmpty()){ args.reset(); }

  while(term->isApplication()){
    args.push_front(*term->nthArgument(3)); 
    head = *term->nthArgument(2);
    if(head.isTerm()){ 
      term = head.term();
    } else {  break; }
  }  
}